

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O2

void __thiscall Js::ByteCodeWriter::Data::Encode(Data *this,OpCodeAsmJs op,ByteCodeWriter *writer)

{
  EncodeT<(Js::LayoutSize)0>(this,op,writer,false);
  return;
}

Assistant:

void Encode(OpCodeAsmJs op, ByteCodeWriter* writer){ EncodeT<Js::SmallLayout>(op, writer, /*isPatching*/false); }